

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

SmallVectorImpl<ParserError> * __thiscall
llvm_vecsmall::SmallVectorImpl<ParserError>::operator=
          (SmallVectorImpl<ParserError> *this,SmallVectorImpl<ParserError> *RHS)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  long *plVar4;
  long *plVar5;
  long *plVar6;
  long lVar7;
  ulong MinSize;
  ulong uVar8;
  long *plVar9;
  ulong uVar10;
  
  if (this != RHS) {
    plVar6 = (long *)(RHS->super_SmallVectorTemplateBase<ParserError,_false>).
                     super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.BeginX
    ;
    plVar4 = (long *)(RHS->super_SmallVectorTemplateBase<ParserError,_false>).
                     super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX;
    uVar8 = (long)plVar4 - (long)plVar6;
    MinSize = ((long)uVar8 >> 4) * -0x5555555555555555;
    plVar9 = (long *)(this->super_SmallVectorTemplateBase<ParserError,_false>).
                     super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.BeginX
    ;
    plVar5 = (long *)(this->super_SmallVectorTemplateBase<ParserError,_false>).
                     super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX;
    uVar3 = (long)plVar5 - (long)plVar9;
    uVar10 = ((long)uVar3 >> 4) * -0x5555555555555555;
    if (uVar10 < MinSize) {
      if ((ulong)((long)(this->super_SmallVectorTemplateBase<ParserError,_false>).
                        super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.
                        CapacityX - (long)plVar9) < uVar8) {
        if (plVar5 != plVar9) {
          plVar6 = plVar5 + -2;
          do {
            if (plVar6 != (long *)plVar6[-2]) {
              operator_delete((long *)plVar6[-2],*plVar6 + 1);
            }
            plVar4 = plVar6 + -4;
            plVar6 = plVar6 + -6;
          } while (plVar4 != plVar9);
          plVar9 = (long *)(this->super_SmallVectorTemplateBase<ParserError,_false>).
                           super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.
                           BeginX;
        }
        (this->super_SmallVectorTemplateBase<ParserError,_false>).
        super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX = plVar9;
        SmallVectorTemplateBase<ParserError,_false>::grow
                  (&this->super_SmallVectorTemplateBase<ParserError,_false>,MinSize);
        uVar10 = 0;
      }
      else if (plVar5 == plVar9) {
        uVar10 = 0;
      }
      else if (0 < (long)uVar3) {
        uVar3 = uVar3 / 0x30 + 1;
        lVar7 = 0;
        do {
          uVar2 = ((undefined8 *)(lVar7 + (long)plVar6))[1];
          puVar1 = (undefined8 *)(lVar7 + (long)plVar9);
          *puVar1 = *(undefined8 *)(lVar7 + (long)plVar6);
          puVar1[1] = uVar2;
          std::__cxx11::string::_M_assign((string *)(puVar1 + 2));
          uVar3 = uVar3 - 1;
          lVar7 = lVar7 + 0x30;
        } while (1 < uVar3);
      }
      std::__uninitialized_copy<false>::__uninit_copy<ParserError_const*,ParserError*>
                ((ParserError *)
                 ((long)(RHS->super_SmallVectorTemplateBase<ParserError,_false>).
                        super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.
                        BeginX + uVar10 * 0x30),
                 (ParserError *)
                 (RHS->super_SmallVectorTemplateBase<ParserError,_false>).
                 super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX,
                 (ParserError *)
                 (uVar10 * 0x30 +
                 (long)(this->super_SmallVectorTemplateBase<ParserError,_false>).
                       super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.
                       BeginX));
      plVar9 = (long *)(uVar8 + (long)(this->super_SmallVectorTemplateBase<ParserError,_false>).
                                      super_SmallVectorTemplateCommon<ParserError,_void>.
                                      super_SmallVectorBase.BeginX);
    }
    else {
      if (0 < (long)uVar8 && plVar4 != plVar6) {
        uVar3 = uVar8 / 0x30 + 1;
        do {
          lVar7 = plVar6[1];
          *plVar9 = *plVar6;
          plVar9[1] = lVar7;
          std::__cxx11::string::_M_assign((string *)(plVar9 + 2));
          plVar9 = plVar9 + 6;
          uVar3 = uVar3 - 1;
          plVar6 = plVar6 + 6;
        } while (1 < uVar3);
        plVar5 = (long *)(this->super_SmallVectorTemplateBase<ParserError,_false>).
                         super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.
                         EndX;
      }
      if (plVar5 != plVar9) {
        plVar6 = plVar5 + -2;
        do {
          if (plVar6 != (long *)plVar6[-2]) {
            operator_delete((long *)plVar6[-2],*plVar6 + 1);
          }
          plVar4 = plVar6 + -4;
          plVar6 = plVar6 + -6;
        } while (plVar4 != plVar9);
      }
    }
    (this->super_SmallVectorTemplateBase<ParserError,_false>).
    super_SmallVectorTemplateCommon<ParserError,_void>.super_SmallVectorBase.EndX = plVar9;
  }
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->setEnd(NewEnd);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);
  return *this;
}